

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O1

asn_dec_rval_t
OCTET_STRING_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  bool bVar1;
  bool bVar2;
  asn_per_constraints_t *paVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  long *plVar8;
  void *pvVar9;
  ssize_t sVar10;
  size_t sVar11;
  asn_per_constraint_s *paVar12;
  asn_OS_Subvariant aVar13;
  ulong uVar14;
  uint8_t *buf;
  asn_OCTET_STRING_specifics_t *paVar15;
  asn_per_constraints_t *paVar16;
  ulong uVar17;
  long lVar18;
  asn_dec_rval_t aVar19;
  long local_70;
  int repeat;
  asn_per_constraints_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  paVar15 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar15 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  paVar16 = constraints;
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar16 = &asn_DEF_OCTET_STRING_constraints;
  }
  paVar3 = constraints;
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar3 = &asn_DEF_OCTET_STRING_constraints;
  }
  aVar13 = paVar15->subvariant;
  uVar14 = (ulong)aVar13;
  sVar11 = 0;
  uVar7 = 2;
  if (3 < aVar13 - ASN_OSUBV_BIT) goto LAB_0014902f;
  local_70 = 0;
  plVar8 = (long *)*sptr;
  switch(aVar13) {
  case ASN_OSUBV_BIT:
    bVar2 = true;
    break;
  case ASN_OSUBV_STR:
    uVar14 = 8;
    local_70 = 1;
    if (((paVar16->value).flags & APC_CONSTRAINED) == APC_UNCONSTRAINED) {
      bVar2 = false;
      aVar13 = 8;
    }
    else {
LAB_00148d85:
      aVar13 = (asn_OS_Subvariant)uVar14;
      uVar14 = (ulong)(uint)(paVar16->value).range_bits;
      bVar2 = false;
    }
    break;
  case ASN_OSUBV_U16:
    uVar14 = 0x10;
    local_70 = 2;
    if (((paVar16->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) goto LAB_00148d85;
    bVar2 = false;
    aVar13 = 0x10;
    break;
  case ASN_OSUBV_U32:
    uVar14 = 0x20;
    local_70 = 4;
    if (((paVar16->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) goto LAB_00148d85;
    bVar2 = false;
    aVar13 = 0x20;
  }
  local_50 = constraints;
  if (plVar8 == (long *)0x0) {
    plVar8 = (long *)calloc(1,(long)paVar15->struct_size);
    *sptr = plVar8;
    if (plVar8 != (long *)0x0) goto LAB_00148dbc;
LAB_00148fe7:
    sVar11 = 0;
    uVar7 = 2;
  }
  else {
LAB_00148dbc:
    paVar12 = &paVar3->size;
    if (((paVar16->size).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      iVar4 = per_get_few_bits(pd,1);
      paVar12 = &asn_DEF_OCTET_STRING_constraints.size;
      if (iVar4 == 0) {
        paVar12 = &paVar3->size;
      }
      paVar3 = &asn_DEF_OCTET_STRING_constraints;
      uVar17 = (ulong)aVar13;
      if (iVar4 == 0) {
        paVar3 = paVar16;
        uVar17 = uVar14;
      }
      uVar14 = uVar17;
      paVar16 = paVar3;
      if (iVar4 < 0) {
        sVar11 = 0;
        uVar7 = 1;
        goto LAB_0014902f;
      }
    }
    if (-1 < paVar12->effective_bits) {
      free((void *)*plVar8);
      iVar5 = (int)paVar12->upper_bound * (uint)local_70;
      if (bVar2) {
        iVar5 = (int)(paVar12->upper_bound + 7U >> 3);
      }
      *(int *)(plVar8 + 1) = iVar5;
      pvVar9 = malloc((long)(iVar5 + 1));
      *plVar8 = (long)pvVar9;
      if (pvVar9 == (void *)0x0) {
        *(undefined4 *)(plVar8 + 1) = 0;
        goto LAB_00148fe7;
      }
    }
    if (paVar12->effective_bits == 0) {
      if (bVar2) {
        iVar5 = per_get_many_bits(pd,(uint8_t *)*plVar8,0,(int)paVar12->upper_bound * (uint)uVar14);
      }
      else {
        iVar5 = OCTET_STRING_per_get_characters
                          (pd,(uint8_t *)*plVar8,paVar12->upper_bound,(uint)local_70,(uint)uVar14,
                           (paVar16->value).lower_bound,(paVar16->value).upper_bound,local_50);
        if (0 < iVar5) goto LAB_00148fe7;
      }
      if (-1 < iVar5) {
        sVar11 = uVar14 * paVar12->upper_bound;
        *(undefined1 *)(*plVar8 + (long)(int)plVar8[1]) = 0;
        if (bVar2) {
          uVar6 = (uint)paVar12->upper_bound & 7;
          iVar5 = 8 - uVar6;
          if (uVar6 == 0) {
            iVar5 = 0;
          }
          *(int *)((long)plVar8 + 0xc) = iVar5;
        }
        uVar7 = 0;
        goto LAB_0014902f;
      }
      uVar7 = 1;
    }
    else {
      *(undefined4 *)(plVar8 + 1) = 0;
      local_38 = local_70;
      uVar7 = 1;
      local_48 = uVar14;
      local_40 = uVar14;
      do {
        sVar10 = uper_get_length(pd,paVar12->effective_bits,&repeat);
        if (sVar10 < 0) {
LAB_00148f5a:
          bVar1 = false;
          uVar7 = 1;
        }
        else {
          uVar14 = sVar10 + paVar12->lower_bound;
          if (bVar2) {
            lVar18 = (long)(uVar14 + 7) >> 3;
            uVar17 = uVar14;
            if ((uVar14 & 7) != 0) {
              *(int *)((long)plVar8 + 0xc) = 8 - (int)(uVar14 & 7);
            }
          }
          else {
            lVar18 = uVar14 * local_38;
            uVar17 = lVar18 * local_40;
          }
          pvVar9 = realloc((void *)*plVar8,(int)plVar8[1] + lVar18 + 1);
          if (pvVar9 == (void *)0x0) {
LAB_00148f45:
            bVar1 = false;
            uVar7 = 2;
          }
          else {
            *plVar8 = (long)pvVar9;
            buf = (uint8_t *)((long)(int)plVar8[1] + (long)pvVar9);
            if (bVar2) {
              iVar5 = per_get_many_bits(pd,buf,0,(int)uVar17);
            }
            else {
              iVar5 = OCTET_STRING_per_get_characters
                                (pd,buf,uVar14,(uint)local_70,(uint)local_48,
                                 (paVar16->value).lower_bound,(paVar16->value).upper_bound,local_50)
              ;
              if (0 < iVar5) goto LAB_00148f45;
            }
            if (iVar5 < 0) goto LAB_00148f5a;
            *(int *)(plVar8 + 1) = (int)plVar8[1] + (int)lVar18;
            bVar1 = true;
          }
        }
        if (!bVar1) {
          sVar11 = 0;
          goto LAB_0014902f;
        }
      } while (repeat != 0);
      *(undefined1 *)(*plVar8 + (long)(int)plVar8[1]) = 0;
      uVar7 = 0;
    }
    sVar11 = 0;
  }
LAB_0014902f:
  aVar19.consumed = sVar11;
  aVar19._0_8_ = uVar7;
  return aVar19;
}

Assistant:

asn_dec_rval_t
OCTET_STRING_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	asn_dec_rval_t rval = { RC_OK, 0 };
	BIT_STRING_t *st = (BIT_STRING_t *)*sptr;
	ssize_t consumed_myself = 0;
	int repeat;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;

	(void)opt_codec_ctx;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN_DEBUG("Unrecognized subvariant %d", specs->subvariant);
		RETURN(RC_FAIL);
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		break;
	}

	/*
	 * Allocate the string.
	 */
	if(!st) {
		st = (BIT_STRING_t *)(*sptr = CALLOC(1, specs->struct_size));
		if(!st) RETURN(RC_FAIL);
	}

	ASN_DEBUG("PER Decoding %s size %ld .. %ld bits %d",
		csiz->flags & APC_EXTENSIBLE ? "extensible" : "non-extensible",
		csiz->lower_bound, csiz->upper_bound, csiz->effective_bits);

	if(csiz->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) RETURN(RC_WMORE);
		if(inext) {
			csiz = &asn_DEF_OCTET_STRING_constraints.size;
			cval = &asn_DEF_OCTET_STRING_constraints.value;
			unit_bits = canonical_unit_bits;
		}
	}

	if(csiz->effective_bits >= 0) {
		FREEMEM(st->buf);
		if(bpc) {
			st->size = csiz->upper_bound * bpc;
		} else {
			st->size = (csiz->upper_bound + 7) >> 3;
		}
		st->buf = (uint8_t *)MALLOC(st->size + 1);
		if(!st->buf) { st->size = 0; RETURN(RC_FAIL); }
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits == 0) {
		int ret;
		if(bpc) {
			ASN_DEBUG("Encoding OCTET STRING size %ld",
				csiz->upper_bound);
			ret = OCTET_STRING_per_get_characters(pd, st->buf,
				csiz->upper_bound, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ASN_DEBUG("Encoding BIT STRING size %ld",
				csiz->upper_bound);
			ret = per_get_many_bits(pd, st->buf, 0,
					    unit_bits * csiz->upper_bound);
		}
		if(ret < 0) RETURN(RC_WMORE);
		consumed_myself += unit_bits * csiz->upper_bound;
		st->buf[st->size] = 0;
		if(bpc == 0) {
			int ubs = (csiz->upper_bound & 0x7);
			st->bits_unused = ubs ? 8 - ubs : 0;
		}
		RETURN(RC_OK);
	}

	st->size = 0;
	do {
		ssize_t raw_len;
		ssize_t len_bytes;
		ssize_t len_bits;
		void *p;
		int ret;

		/* Get the PER length */
		raw_len = uper_get_length(pd, csiz->effective_bits, &repeat);
		if(raw_len < 0) RETURN(RC_WMORE);
		raw_len += csiz->lower_bound;

		ASN_DEBUG("Got PER length eb %ld, len %ld, %s (%s)",
			(long)csiz->effective_bits, (long)raw_len,
			repeat ? "repeat" : "once", td->name);
		if(bpc) {
			len_bytes = raw_len * bpc;
			len_bits = len_bytes * unit_bits;
		} else {
			len_bits = raw_len;
			len_bytes = (len_bits + 7) >> 3;
			if(len_bits & 0x7)
				st->bits_unused = 8 - (len_bits & 0x7);
			/* len_bits be multiple of 16K if repeat is set */
		}
		p = REALLOC(st->buf, st->size + len_bytes + 1);
		if(!p) RETURN(RC_FAIL);
		st->buf = (uint8_t *)p;

		if(bpc) {
			ret = OCTET_STRING_per_get_characters(pd,
				&st->buf[st->size], raw_len, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ret = per_get_many_bits(pd, &st->buf[st->size],
				0, len_bits);
		}
		if(ret < 0) RETURN(RC_WMORE);
		st->size += len_bytes;
	} while(repeat);
	st->buf[st->size] = 0;	/* nul-terminate */

	return rval;
}